

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnode.c
# Opt level: O1

int lnode_openlibs(lua_State *L)

{
  lua_getglobal(L,"package");
  lua_getfield(L,-1,"loaded");
  lua_rotate(L,-2,-1);
  lua_settop(L,-2);
  luaopen_luv(L);
  lua_setfield(L,-2,"uv");
  lua_settop(L,-2);
  lua_getglobal(L,"package");
  lua_getfield(L,-1,"preload");
  lua_rotate(L,-2,-1);
  lua_settop(L,-2);
  lua_pushcclosure(L,luaopen_cjson,0);
  lua_setfield(L,-2,"cjson");
  lua_pushcclosure(L,luaopen_env,0);
  lua_setfield(L,-2,"env");
  lua_pushcclosure(L,luaopen_lhttp_parser,0);
  lua_setfield(L,-2,"lhttp_parser");
  lua_pushcclosure(L,luaopen_lmessage,0);
  lua_setfield(L,-2,"lmessage");
  lua_pushcclosure(L,luaopen_lnode,0);
  lua_setfield(L,-2,"lnode");
  lua_pushcclosure(L,luaopen_lutils,0);
  lua_setfield(L,-2,"lutils");
  lua_pushcclosure(L,luaopen_miniz,0);
  lua_setfield(L,-2,"miniz");
  lua_settop(L,-2);
  return 0;
}

Assistant:

LUALIB_API int lnode_openlibs(lua_State *L)
{
    // Get package.loaded, so we can store uv in it.
    lua_getglobal(L, "package");
    lua_getfield(L, -1, "loaded");
    lua_remove(L, -2); // Remove package

    // Store uv module definition at loaded.luv
    luaopen_luv(L);
    lua_setfield(L, -2, "luv");
    lua_pop(L, 1);

    // Get package.preload so we can store builtins in it.
    lua_getglobal(L, "package");
    lua_getfield(L, -1, "preload");
    lua_remove(L, -2); // Remove package

#ifdef WITH_CJSON
    lua_pushcfunction(L, luaopen_cjson);
    lua_setfield(L, -2, "cjson");
#endif

#ifdef WITH_LUTILS
    lua_pushcfunction(L, luaopen_lutils);
    lua_setfield(L, -2, "lutils");
#endif

#ifdef WITH_LUTILS
    lua_pushcfunction(L, luaopen_snapshot);
    lua_setfield(L, -2, "snapshot");
#endif

#ifdef WITH_MINIZ
    lua_pushcfunction(L, luaopen_miniz);
    lua_setfield(L, -2, "miniz");
#endif

#ifdef BUILD_SQLITE
    lua_pushcfunction(L, luaopen_lsqlite);
    lua_setfield(L, -2, "lsqlite");
#endif

#ifdef BUILD_MODBUS
    lua_pushcfunction(L, luaopen_lmodbus);
    lua_setfield(L, -2, "lmodbus");
#endif

#ifdef BUILD_MBEDTLS
    lua_pushcfunction(L, luaopen_lmbedtls_pk);
    lua_setfield(L, -2, "lmbedtls.pk");

    lua_pushcfunction(L, luaopen_lmbedtls_md);
    lua_setfield(L, -2, "lmbedtls.md");

    lua_pushcfunction(L, luaopen_lmbedtls_rng);
    lua_setfield(L, -2, "lmbedtls.rng");

    lua_pushcfunction(L, luaopen_lmbedtls_tls);
    lua_setfield(L, -2, "lmbedtls.tls");

    lua_pushcfunction(L, luaopen_lmbedtls_cipher);
    lua_setfield(L, -2, "lmbedtls.cipher");
    
    lua_pushcfunction(L, luaopen_lmbedtls_x509_crl);
    lua_setfield(L, -2, "lmbedtls.x509.crl");

    lua_pushcfunction(L, luaopen_lmbedtls_x509_csr);
    lua_setfield(L, -2, "lmbedtls.x509.csr");
#endif

    // Store lnode module definition at preload.lnode
    lua_pushcfunction(L, luaopen_lnode);
    lua_setfield(L, -2, "lnode");

    lua_pop(L, 1);

    return 0;
}